

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grammar.cpp
# Opt level: O2

size_t __thiscall
SGParser::Generator::GrammarOutputC::CreateNonterminalEnum
          (GrammarOutputC *this,String *str,String *name,String *prefix)

{
  Grammar *this_00;
  size_t sVar1;
  undefined8 uVar2;
  char *__lhs;
  undefined1 auStack_f8 [8];
  vector<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  nonterminalVec;
  String local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  size_type *local_98;
  String dest;
  undefined1 local_70 [8];
  anon_class_32_4_842515b9 listEnumValues;
  anon_class_8_1_82fec0c9 local_40 [2];
  
  this_00 = (this->super_GrammarOutput).pGrammar;
  if (this_00 == (Grammar *)0x0) {
    uVar2 = 0;
  }
  else {
    local_98 = &dest._M_string_length;
    dest._M_dataplus._M_p = (pointer)0x0;
    dest._M_string_length._0_1_ = 0;
    auStack_f8 = (undefined1  [8])0x0;
    nonterminalVec.
    super__Vector_base<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    nonterminalVec.
    super__Vector_base<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_d8.field_2._M_allocated_capacity = (size_type)str;
    sVar1 = Grammar::CreateNonterminalVector
                      (this_00,(vector<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                                *)auStack_f8);
    local_d8._M_dataplus._M_p = (pointer)auStack_f8;
    local_d8._M_string_length = sVar1;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &listEnumValues.enumValueNameGenerator,"//////////////////////////// ",name);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &listEnumValues.enumValueNameGenerator," ////////////////////////////\n\n");
    std::__cxx11::string::append((string *)&local_98);
    std::__cxx11::string::~string((string *)local_70);
    std::__cxx11::string::~string((string *)&listEnumValues.enumValueNameGenerator);
    dest.field_2._8_8_ = &this->namespaceName;
    if ((this->namespaceName)._M_string_length != 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &listEnumValues.enumValueNameGenerator,"namespace ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     dest.field_2._8_8_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &listEnumValues.enumValueNameGenerator,"\n{\n\n");
      std::__cxx11::string::append((string *)&local_98);
      std::__cxx11::string::~string((string *)local_70);
      std::__cxx11::string::~string((string *)&listEnumValues.enumValueNameGenerator);
    }
    __lhs = "enum ";
    if (this->useEnumClasses != false) {
      __lhs = "enum class ";
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &listEnumValues.enumValueNameGenerator,__lhs,name);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &listEnumValues.enumValueNameGenerator,"\n{\n");
    local_d8.field_2._8_8_ = sVar1;
    std::__cxx11::string::append((string *)&local_98);
    std::__cxx11::string::~string((string *)local_70);
    std::__cxx11::string::~string((string *)&listEnumValues.enumValueNameGenerator);
    local_70 = (undefined1  [8])&local_d8._M_string_length;
    listEnumValues.prefix = &local_d8;
    listEnumValues.enumValueNameGenerator = local_40;
    local_40[0].nonterminalVec._0_1_ = 0;
    listEnumValues.size = (size_t *)&local_98;
    listEnumValues.str = prefix;
    createEnum<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/ParserGen/Grammar.cpp:1645:16)>
    ::anon_class_32_4_842515b9::operator()
              ((anon_class_32_4_842515b9 *)local_70,(String *)&listEnumValues.enumValueNameGenerator
              );
    std::__cxx11::string::~string((string *)&listEnumValues.enumValueNameGenerator);
    std::__cxx11::string::append((char *)&local_98);
    if (this->createEnumStrings == true) {
      std::operator+(&local_b8,"\nconstexpr char const* const StringifyEnum",name);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &listEnumValues.enumValueNameGenerator,&local_b8,"[] =\n{\n");
      std::__cxx11::string::append((string *)&local_98);
      std::__cxx11::string::~string((string *)&listEnumValues.enumValueNameGenerator);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&listEnumValues.enumValueNameGenerator,"\"",(allocator<char> *)&local_b8)
      ;
      createEnum<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/ParserGen/Grammar.cpp:1645:16)>
      ::anon_class_32_4_842515b9::operator()
                ((anon_class_32_4_842515b9 *)local_70,
                 (String *)&listEnumValues.enumValueNameGenerator);
      std::__cxx11::string::~string((string *)&listEnumValues.enumValueNameGenerator);
      std::__cxx11::string::append((char *)&local_98);
    }
    if ((this->namespaceName)._M_string_length != 0) {
      std::operator+(&local_b8,"\n} // namespace ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     dest.field_2._8_8_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &listEnumValues.enumValueNameGenerator,&local_b8,"\n");
      std::__cxx11::string::append((string *)&local_98);
      std::__cxx11::string::~string((string *)&listEnumValues.enumValueNameGenerator);
      std::__cxx11::string::~string((string *)&local_b8);
    }
    std::__cxx11::string::swap((string *)local_d8.field_2._M_allocated_capacity);
    std::
    _Vector_base<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
    ::~_Vector_base((_Vector_base<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                     *)auStack_f8);
    uVar2 = local_d8.field_2._8_8_;
    std::__cxx11::string::~string((string *)&local_98);
  }
  return uVar2;
}

Assistant:

size_t GrammarOutputC::CreateNonterminalEnum(String& str, const String& name,
                                             const String& prefix) const {
    if (!pGrammar)
        return 0u;

    String dest;

    std::vector<const String*> nonterminalVec;
    const auto size = pGrammar->CreateNonterminalVector(nonterminalVec);

    // Generate strings
    createEnum(dest, name, prefix, size,
               [&](size_t index) {
                   const auto& valueName = *nonterminalVec[index];
                   // Check why this special case exists
                   return valueName == "[Accept1]" ? String{"Accept1"} : valueName;
               });

    str.swap(dest);

    return size;
}